

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::LossLayer::SharedDtor(LossLayer *this)

{
  bool bVar1;
  string *default_value;
  LossLayer *this_local;
  
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->name_,default_value);
  bVar1 = has_LossLayerType(this);
  if (bVar1) {
    clear_LossLayerType(this);
  }
  return;
}

Assistant:

void LossLayer::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (has_LossLayerType()) {
    clear_LossLayerType();
  }
}